

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O3

Vec_Int_t * Gia_ManGetDangling(Gia_Man_t *p)

{
  byte *pbVar1;
  long lVar2;
  Vec_Int_t *p_00;
  int *piVar3;
  Gia_Obj_t *pGVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  
  uVar7 = (ulong)(uint)p->nObjs;
  if ((0 < p->nObjs) && (pGVar4 = p->pObjs, pGVar4 != (Gia_Obj_t *)0x0)) {
    lVar2 = 0;
    do {
      uVar7 = *(ulong *)pGVar4;
      *(ulong *)pGVar4 = uVar7 & 0xffffffffbfffffff;
      uVar5 = uVar7 & 0x1fffffff;
      if (uVar5 == 0x1fffffff || (int)uVar7 < 0) {
        if ((int)uVar7 < 0 && (int)uVar5 != 0x1fffffff) goto LAB_0024208f;
      }
      else {
        pGVar4[-uVar5].field_0x3 = pGVar4[-uVar5].field_0x3 | 0x40;
        uVar5 = (ulong)(*(uint *)&pGVar4->field_0x4 & 0x1fffffff);
LAB_0024208f:
        pGVar4[-uVar5].field_0x3 = pGVar4[-uVar5].field_0x3 | 0x40;
      }
      lVar2 = lVar2 + 1;
      uVar7 = (ulong)p->nObjs;
    } while ((lVar2 < (long)uVar7) && (pGVar4 = p->pObjs + lVar2, p->pObjs != (Gia_Obj_t *)0x0));
  }
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 100;
  p_00->nSize = 0;
  piVar3 = (int *)malloc(400);
  p_00->pArray = piVar3;
  if (0 < (int)uVar7) {
    lVar2 = 0;
    lVar8 = 0;
    do {
      iVar6 = (int)uVar7;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      uVar5 = *(ulong *)(&p->pObjs->field_0x0 + lVar2);
      if ((uVar5 & 0xc0000000) == 0 && (~(uint)uVar5 & 0x1fffffff) != 0) {
        Vec_IntPush(p_00,(int)lVar8);
        uVar7 = (ulong)(uint)p->nObjs;
      }
      lVar8 = lVar8 + 1;
      iVar6 = (int)uVar7;
      lVar2 = lVar2 + 0xc;
    } while (lVar8 < iVar6);
    if (0 < iVar6) {
      lVar2 = 0;
      lVar8 = 0;
      do {
        if (p->pObjs == (Gia_Obj_t *)0x0) {
          return p_00;
        }
        pbVar1 = &p->pObjs->field_0x3 + lVar2;
        *pbVar1 = *pbVar1 & 0xbf;
        lVar8 = lVar8 + 1;
        lVar2 = lVar2 + 0xc;
      } while (lVar8 < p->nObjs);
    }
  }
  return p_00;
}

Assistant:

Vec_Int_t * Gia_ManGetDangling( Gia_Man_t * p )
{
    Vec_Int_t * vDangles;
    Gia_Obj_t * pObj;
    int i;
    Gia_ManForEachObj( p, pObj, i )
    {
        pObj->fMark0 = 0;
        if ( Gia_ObjIsAnd(pObj) )
        {
            Gia_ObjFanin0(pObj)->fMark0 = 1;
            Gia_ObjFanin1(pObj)->fMark0 = 1;
        }
        else if ( Gia_ObjIsCo(pObj) )
            Gia_ObjFanin0(pObj)->fMark0 = 1;
    }
    vDangles = Vec_IntAlloc( 100 );
    Gia_ManForEachAnd( p, pObj, i )
        if ( !pObj->fMark0 )
            Vec_IntPush( vDangles, i );
    Gia_ManCleanMark0( p );
    return vDangles;
}